

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::ExecuteEchoColor
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  pointer pbVar1;
  bool bVar2;
  bool newline;
  int iVar3;
  long lVar4;
  FILE *pFVar5;
  unsigned_long uVar6;
  _Alloc_hider _Var7;
  string *this;
  char *c;
  _Alloc_hider _Var8;
  ulong uVar9;
  uint local_c8;
  bool local_c1;
  int local_b4;
  string fName;
  string progressDir;
  string dirName;
  string local_50;
  
  progressDir._M_dataplus._M_p = (pointer)&progressDir.field_2;
  progressDir._M_string_length = 0;
  progressDir.field_2._M_local_buf[0] = '\0';
  newline = true;
  local_c1 = true;
  local_c8 = 0;
  uVar9 = 2;
LAB_00268cd8:
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9) {
    std::__cxx11::string::~string((string *)&progressDir);
    return 0;
  }
  lVar4 = std::__cxx11::string::find((char *)(pbVar1 + uVar9),0x477908);
  if (lVar4 == 0) {
    std::__cxx11::string::substr
              ((ulong)&dirName,
               (ulong)((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
    this = &dirName;
    if (dirName._M_string_length != 0) {
      local_c1 = cmSystemTools::IsOn(dirName._M_dataplus._M_p);
    }
    goto LAB_00268fbf;
  }
  bVar2 = cmHasLiteralPrefix<std::__cxx11::string,16ul>
                    ((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar9,
                     (char (*) [16])"--progress-dir=");
  if (!bVar2) {
    bVar2 = cmHasLiteralPrefix<std::__cxx11::string,16ul>
                      ((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9,
                       (char (*) [16])"--progress-num=");
    if (!bVar2) {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"--normal");
      if (bVar2) {
        local_c8 = 0;
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"--black");
        if (bVar2) {
          local_c8 = 1;
        }
        else {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,"--red");
          if (bVar2) {
            local_c8 = 2;
          }
          else {
            bVar2 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,"--green");
            if (bVar2) {
              local_c8 = 3;
            }
            else {
              bVar2 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9,"--yellow")
              ;
              if (bVar2) {
                local_c8 = 4;
              }
              else {
                bVar2 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar9,"--blue")
                ;
                if (bVar2) {
                  local_c8 = 5;
                }
                else {
                  bVar2 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                          "--magenta");
                  if (bVar2) {
                    local_c8 = 6;
                  }
                  else {
                    bVar2 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                            "--cyan");
                    if (bVar2) {
                      local_c8 = 7;
                    }
                    else {
                      bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                              "--white");
                      if (bVar2) {
                        local_c8 = 8;
                      }
                      else {
                        bVar2 = std::operator==((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                                "--bold");
                        if (bVar2) {
                          local_c8 = local_c8 | 0x100;
                        }
                        else {
                          bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar9
                                                  ,"--no-newline");
                          if (bVar2) {
                            newline = false;
                          }
                          else {
                            bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar9
                                                  ,"--newline");
                            if (bVar2) {
                              newline = true;
                            }
                            else {
                              cmSystemTools::MakefileColorEcho
                                        (local_c8,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar9].
                                                  _M_dataplus._M_p,newline,local_c1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00268fc4;
    }
    if (progressDir._M_string_length == 0) goto LAB_00268fc4;
    std::__cxx11::string::substr
              ((ulong)&local_50,
               (ulong)((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
    std::__cxx11::string::string((string *)&dirName,(string *)&progressDir);
    std::__cxx11::string::append((char *)&dirName);
    fName._M_dataplus._M_p = (pointer)&fName.field_2;
    fName._M_string_length = 0;
    fName.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&fName);
    std::__cxx11::string::append((char *)&fName);
    pFVar5 = (FILE *)cmsys::SystemTools::Fopen(&fName,"r");
    local_b4 = 0;
    if (pFVar5 != (FILE *)0x0) {
      iVar3 = __isoc99_fscanf(pFVar5,"%i",&local_b4);
      if (iVar3 != 1) {
        cmSystemTools::Message("Could not read from progress file.",(char *)0x0);
      }
      fclose(pFVar5);
      _Var7._M_p = local_50._M_dataplus._M_p;
      _Var8._M_p = local_50._M_dataplus._M_p;
      do {
        if ((*_Var8._M_p == ',') || (*_Var8._M_p == '\0')) {
          if (_Var8._M_p != _Var7._M_p) {
            std::__cxx11::string::_M_assign((string *)&fName);
            std::__cxx11::string::append((char *)&fName);
            std::__cxx11::string::append((char *)&fName,(ulong)_Var7._M_p);
            pFVar5 = (FILE *)cmsys::SystemTools::Fopen(&fName,"w");
            if (pFVar5 != (FILE *)0x0) {
              fwrite("empty",5,1,pFVar5);
              fclose(pFVar5);
            }
          }
          if (*_Var8._M_p == '\0') goto LAB_00268f69;
          _Var7._M_p = _Var8._M_p + 1;
        }
        _Var8._M_p = _Var8._M_p + 1;
      } while( true );
    }
    goto LAB_00268faa;
  }
  std::__cxx11::string::substr
            ((ulong)&dirName,
             (ulong)((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar9));
  std::__cxx11::string::operator=((string *)&progressDir,(string *)&dirName);
  std::__cxx11::string::~string((string *)&dirName);
  goto LAB_00268fc4;
LAB_00268f69:
  uVar6 = cmsys::Directory::GetNumberOfFilesInDirectory(&dirName);
  if (0 < local_b4) {
    fprintf(_stdout,"[%3i%%] ",(long)((int)uVar6 * 100 + -300) / (long)local_b4 & 0xffffffff);
  }
LAB_00268faa:
  std::__cxx11::string::~string((string *)&fName);
  std::__cxx11::string::~string((string *)&dirName);
  this = &local_50;
LAB_00268fbf:
  std::__cxx11::string::~string((string *)this);
LAB_00268fc4:
  uVar9 = (ulong)((int)uVar9 + 1);
  goto LAB_00268cd8;
}

Assistant:

int cmcmd::ExecuteEchoColor(std::vector<std::string>& args)
{
  // The arguments are
  //   argv[0] == <cmake-executable>
  //   argv[1] == cmake_echo_color

  bool enabled = true;
  int color = cmsysTerminal_Color_Normal;
  bool newline = true;
  std::string progressDir;
  for(unsigned int i=2; i < args.size(); ++i)
    {
    if(args[i].find("--switch=") == 0)
      {
      // Enable or disable color based on the switch value.
      std::string value = args[i].substr(9);
      if(!value.empty())
        {
        if(cmSystemTools::IsOn(value.c_str()))
          {
          enabled = true;
          }
        else
          {
          enabled = false;
          }
        }
      }
    else if(cmHasLiteralPrefix(args[i], "--progress-dir="))
      {
      progressDir = args[i].substr(15);
      }
    else if(cmHasLiteralPrefix(args[i], "--progress-num="))
      {
      if (!progressDir.empty())
        {
        std::string const& progressNum = args[i].substr(15);
        cmcmdProgressReport(progressDir, progressNum);
        }
      }
    else if(args[i] == "--normal")
      {
      color = cmsysTerminal_Color_Normal;
      }
    else if(args[i] == "--black")
      {
      color = cmsysTerminal_Color_ForegroundBlack;
      }
    else if(args[i] == "--red")
      {
      color = cmsysTerminal_Color_ForegroundRed;
      }
    else if(args[i] == "--green")
      {
      color = cmsysTerminal_Color_ForegroundGreen;
      }
    else if(args[i] == "--yellow")
      {
      color = cmsysTerminal_Color_ForegroundYellow;
      }
    else if(args[i] == "--blue")
      {
      color = cmsysTerminal_Color_ForegroundBlue;
      }
    else if(args[i] == "--magenta")
      {
      color = cmsysTerminal_Color_ForegroundMagenta;
      }
    else if(args[i] == "--cyan")
      {
      color = cmsysTerminal_Color_ForegroundCyan;
      }
    else if(args[i] == "--white")
      {
      color = cmsysTerminal_Color_ForegroundWhite;
      }
    else if(args[i] == "--bold")
      {
      color |= cmsysTerminal_Color_ForegroundBold;
      }
    else if(args[i] == "--no-newline")
      {
      newline = false;
      }
    else if(args[i] == "--newline")
      {
      newline = true;
      }
    else
      {
      // Color is enabled.  Print with the current color.
      cmSystemTools::MakefileColorEcho(color, args[i].c_str(),
                                       newline, enabled);
      }
    }

  return 0;
}